

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O2

int run_test_udp_open(void)

{
  int iVar1;
  uv_os_sock_t sock;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_buf_t buf;
  sockaddr_in addr;
  uv_udp_t client;
  uv_udp_t client2;
  
  buf = uv_buf_init("PING",4);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    sock = create_udp_socket();
    puVar2 = uv_default_loop();
    iVar1 = uv_udp_init(puVar2,&client);
    if (iVar1 == 0) {
      iVar1 = uv_udp_open(&client,sock);
      if (iVar1 == 0) {
        iVar1 = uv_udp_bind(&client,(sockaddr *)&addr,0);
        if (iVar1 == 0) {
          iVar1 = uv_udp_recv_start(&client,alloc_cb,recv_cb);
          if (iVar1 == 0) {
            iVar1 = uv_udp_send(&send_req,&client,&buf,1,(sockaddr *)&addr,send_cb);
            if (iVar1 == 0) {
              puVar2 = uv_default_loop();
              iVar1 = uv_udp_init(puVar2,&client2);
              if (iVar1 == 0) {
                iVar1 = uv_udp_open(&client2,sock);
                if (iVar1 == -0x11) {
                  uv_close((uv_handle_t *)&client2,(uv_close_cb)0x0);
                  puVar2 = uv_default_loop();
                  uv_run(puVar2,UV_RUN_DEFAULT);
                  if (send_cb_called == 1) {
                    if (close_cb_called == 1) {
                      if (client.send_queue_size == 0) {
                        puVar2 = uv_default_loop();
                        close_loop(puVar2);
                        puVar2 = uv_default_loop();
                        iVar1 = uv_loop_close(puVar2);
                        if (iVar1 == 0) {
                          uv_library_shutdown();
                          return 0;
                        }
                        pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                        uVar3 = 0xbf;
                      }
                      else {
                        pcVar4 = "client.send_queue_size == 0";
                        uVar3 = 0xbd;
                      }
                    }
                    else {
                      pcVar4 = "close_cb_called == 1";
                      uVar3 = 0xbb;
                    }
                  }
                  else {
                    pcVar4 = "send_cb_called == 1";
                    uVar3 = 0xba;
                  }
                }
                else {
                  pcVar4 = "r == UV_EEXIST";
                  uVar3 = 0xb0;
                }
              }
              else {
                pcVar4 = "r == 0";
                uVar3 = 0xad;
              }
            }
            else {
              pcVar4 = "r == 0";
              uVar3 = 0xa8;
            }
          }
          else {
            pcVar4 = "r == 0";
            uVar3 = 0xa0;
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar3 = 0x9d;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0x9a;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 0x97;
    }
  }
  else {
    pcVar4 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uVar3 = 0x91;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-open.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(udp_open) {
  struct sockaddr_in addr;
  uv_buf_t buf = uv_buf_init("PING", 4);
  uv_udp_t client, client2;
  uv_os_sock_t sock;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_udp_socket();

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  r = uv_udp_open(&client, sock);
  ASSERT(r == 0);

  r = uv_udp_bind(&client, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT(r == 0);

  r = uv_udp_send(&send_req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT(r == 0);

#ifndef _WIN32
  {
    r = uv_udp_init(uv_default_loop(), &client2);
    ASSERT(r == 0);

    r = uv_udp_open(&client2, sock);
    ASSERT(r == UV_EEXIST);

    uv_close((uv_handle_t*) &client2, NULL);
  }
#else  /* _WIN32 */
  (void)client2;
#endif

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(send_cb_called == 1);
  ASSERT(close_cb_called == 1);

  ASSERT(client.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}